

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuPrivate::syncPlatformMenu(QMenuPrivate *this)

{
  bool bVar1;
  QPlatformMenu *pQVar2;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QPlatformMenuItem *menuItem;
  QPlatformMenuItem *beforeItem;
  QMenu *q;
  const_reverse_iterator end;
  const_reverse_iterator it;
  QList<QAction_*> actions;
  reverse_iterator<QList<QAction_*>::const_iterator> *in_stack_ffffffffffffff98;
  reverse_iterator<QList<QAction_*>::const_iterator> *in_stack_ffffffffffffffa0;
  QPlatformMenuItem *beforeItem_00;
  QAction *action;
  QMenuPrivate *this_00;
  
  this_00 = *(QMenuPrivate **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar1 = QPointer<QPlatformMenu>::isNull((QPointer<QPlatformMenu> *)0x63eb50);
  if (!bVar1) {
    beforeItem_00 = (QPlatformMenuItem *)&DAT_aaaaaaaaaaaaaaaa;
    action = (QAction *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions((QWidget *)in_RDI);
    QList<QAction_*>::rbegin((QList<QAction_*> *)in_RDI);
    QList<QAction_*>::rend((QList<QAction_*> *)in_RDI);
    while (bVar1 = std::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar1) {
      std::reverse_iterator<QList<QAction_*>::const_iterator>::operator*(in_stack_ffffffffffffffa0);
      insertActionInPlatformMenu(this_00,action,beforeItem_00);
      std::reverse_iterator<QList<QAction_*>::const_iterator>::operator++(in_stack_ffffffffffffffa0)
      ;
    }
    pQVar2 = QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x63ec2a);
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,*(ushort *)&in_RDI->field_0x420 >> 3 & 1);
    pQVar2 = QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x63ec5f);
    bVar1 = QWidget::isEnabled((QWidget *)0x63ec6e);
    (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2,bVar1);
    QList<QAction_*>::~QList((QList<QAction_*> *)0x63ec91);
  }
  if (*(QMenuPrivate **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::syncPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        return;

    QPlatformMenuItem *beforeItem = nullptr;
    const QList<QAction*> actions = q->actions();
    for (QList<QAction*>::const_reverse_iterator it = actions.rbegin(), end = actions.rend(); it != end; ++it) {
        QPlatformMenuItem *menuItem = insertActionInPlatformMenu(*it, beforeItem);
        beforeItem = menuItem;
    }
    platformMenu->syncSeparatorsCollapsible(collapsibleSeparators);
    platformMenu->setEnabled(q->isEnabled());
}